

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O0

void __thiscall CS248::OSDText::render(OSDText *this)

{
  bool bVar1;
  long in_RDI;
  OSDLine *in_stack_00000018;
  OSDText *in_stack_00000020;
  iterator it;
  OSDLine *in_stack_ffffffffffffff78;
  OSDLine *in_stack_ffffffffffffff80;
  OSDLine local_60;
  OSDLine *local_18;
  __normal_iterator<CS248::OSDLine_*,_std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>_>
  local_10 [2];
  
  (*__glewUseProgram)(*(GLuint *)(in_RDI + 0x50));
  glEnable(0xbe2);
  glBlendFunc(0x302,0x303);
  local_10[0]._M_current =
       (OSDLine *)
       std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>::begin
                 (in_stack_ffffffffffffff78);
  while( true ) {
    local_18 = (OSDLine *)
               std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>::end
                         ((vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_> *)
                          in_stack_ffffffffffffff78);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<CS248::OSDLine_*,_std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<CS248::OSDLine_*,_std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<CS248::OSDLine_*,_std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>_>
    ::operator*(local_10);
    in_stack_ffffffffffffff80 = &local_60;
    OSDLine::OSDLine(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    draw_line(in_stack_00000020,in_stack_00000018);
    OSDLine::~OSDLine((OSDLine *)0x2056c6);
    __gnu_cxx::
    __normal_iterator<CS248::OSDLine_*,_std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>_>
    ::operator++(local_10);
  }
  (*__glewUseProgram)(0);
  return;
}

Assistant:

void OSDText::render() {

  glUseProgram(program);

  glEnable( GL_BLEND );
  glBlendFunc( GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA );

  vector<OSDLine>::iterator it = lines.begin();
  while(it != lines.end()) {
    draw_line(*it);
    ++it;
  }

  glUseProgram(0);
}